

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::anon_unknown_0::PrecisionFormatCase::test(PrecisionFormatCase *this)

{
  CallLogWrapper *this_00;
  ostringstream *poVar1;
  int iVar2;
  undefined8 uVar3;
  bool bVar4;
  long lVar5;
  NotSupportedError *this_01;
  int iVar6;
  int iVar7;
  allocator<char> aStack_1d8;
  StateQueryMemoryWriteGuard<unsigned_char> shaderCompiler;
  StateQueryMemoryWriteGuard<int> precision;
  StateQueryMemoryWriteGuard<int[2]> range;
  undefined1 local_1b0 [384];
  
  lVar5 = (long)(int)(this->m_precisionType - 0x8df0) * 0xc;
  uVar3 = *(undefined8 *)(&DAT_0181f1b0 + lVar5);
  iVar2 = *(int *)(&DAT_0181f1b8 + lVar5);
  shaderCompiler.m_preguard = 0xde;
  shaderCompiler.m_value = 0xde;
  shaderCompiler.m_postguard = 0xde;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[2]>::StateQueryMemoryWriteGuard(&range);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard(&precision)
  ;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  glu::CallLogWrapper::glGetBooleanv(this_00,0x8dfa,&shaderCompiler.m_value);
  ApiCase::expectError(&this->super_ApiCase,0);
  bVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char>::verifyValidity
                    (&shaderCompiler,
                     (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  if (!bVar4) {
    return;
  }
  if (shaderCompiler.m_value != '\x01') {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,"SHADER_COMPILER = TRUE required",&aStack_1d8);
    tcu::NotSupportedError::NotSupportedError(this_01,(string *)local_1b0);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  glu::CallLogWrapper::glGetShaderPrecisionFormat
            (this_00,this->m_shaderType,this->m_precisionType,range.m_value,&precision.m_value);
  ApiCase::expectError(&this->super_ApiCase,0);
  bVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[2]>::verifyValidity
                    (&range,(this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                            m_testCtx);
  if (!bVar4) {
    return;
  }
  bVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    (&precision,
                     (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  if (!bVar4) {
    return;
  }
  local_1b0._0_8_ = (this->super_ApiCase).m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"range[0] = ");
  std::ostream::operator<<(poVar1,range.m_value[0]);
  std::operator<<((ostream *)poVar1,"\n");
  std::operator<<((ostream *)poVar1,"range[1] = ");
  std::ostream::operator<<(poVar1,range.m_value[1]);
  std::operator<<((ostream *)poVar1,"\n");
  std::operator<<((ostream *)poVar1,"precision = ");
  std::ostream::operator<<(poVar1,precision.m_value);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  if (((this->m_shaderType == 0x8b30) &&
      (((this->m_precisionType == 0x8df5 || (this->m_precisionType == 0x8df2)) &&
       (range.m_value[0] == 0)))) && ((range.m_value[1] == 0 && (precision.m_value == 0)))) {
    return;
  }
  iVar7 = (int)uVar3;
  if (range.m_value[0] < iVar7) {
    local_1b0._0_8_ = (this->super_ApiCase).m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"// ERROR: Invalid range[0], expected greater or equal to ");
    std::ostream::operator<<(poVar1,iVar7);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  iVar6 = (int)((ulong)uVar3 >> 0x20);
  if (range.m_value[1] < iVar6) {
    local_1b0._0_8_ = (this->super_ApiCase).m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"// ERROR: Invalid range[1], expected greater or equal to ");
    std::ostream::operator<<(poVar1,iVar6);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    if (iVar2 <= precision.m_value) goto LAB_00ef5400;
  }
  else if (iVar2 <= precision.m_value) {
    if (iVar7 <= range.m_value[0]) {
      return;
    }
    goto LAB_00ef5400;
  }
  local_1b0._0_8_ = (this->super_ApiCase).m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"// ERROR: Invalid precision, expected greater or equal to ");
  std::ostream::operator<<(poVar1,iVar2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
LAB_00ef5400:
  tcu::TestContext::setTestResult
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             QP_TEST_RESULT_FAIL,"Got invalid precision/range");
  return;
}

Assistant:

void test (void)
	{
		const RequiredFormat											expected = getRequiredFormat();
		bool															error = false;
		gls::StateQueryUtil::StateQueryMemoryWriteGuard<glw::GLboolean>	shaderCompiler;
		gls::StateQueryUtil::StateQueryMemoryWriteGuard<glw::GLint[2]>	range;
		gls::StateQueryUtil::StateQueryMemoryWriteGuard<glw::GLint>		precision;

		// requires SHADER_COMPILER = true
		glGetBooleanv(GL_SHADER_COMPILER, &shaderCompiler);
		expectError(GL_NO_ERROR);

		if (!shaderCompiler.verifyValidity(m_testCtx))
			return;
		if (shaderCompiler != GL_TRUE)
			throw tcu::NotSupportedError("SHADER_COMPILER = TRUE required");

		// query values
		glGetShaderPrecisionFormat(m_shaderType, m_precisionType, range, &precision);
		expectError(GL_NO_ERROR);

		if (!range.verifyValidity(m_testCtx))
			return;
		if (!precision.verifyValidity(m_testCtx))
			return;

		m_log
			<< tcu::TestLog::Message
			<< "range[0] = " << range[0] << "\n"
			<< "range[1] = " << range[1] << "\n"
			<< "precision = " << precision
			<< tcu::TestLog::EndMessage;

		// special case for highp and fragment shader

		if (m_shaderType == GL_FRAGMENT_SHADER && (m_precisionType == GL_HIGH_FLOAT || m_precisionType == GL_HIGH_INT))
		{
			// not supported is a valid return value
			if (range[0] == 0 && range[1] == 0 && precision == 0)
				return;
		}

		// verify the returned values

		if (range[0] < expected.negativeRange)
		{
			m_log << tcu::TestLog::Message << "// ERROR: Invalid range[0], expected greater or equal to " << expected.negativeRange << tcu::TestLog::EndMessage;
			error = true;
		}

		if (range[1] < expected.positiveRange)
		{
			m_log << tcu::TestLog::Message << "// ERROR: Invalid range[1], expected greater or equal to " << expected.positiveRange << tcu::TestLog::EndMessage;
			error = true;
		}

		if (precision < expected.precision)
		{
			m_log << tcu::TestLog::Message << "// ERROR: Invalid precision, expected greater or equal to " << expected.precision << tcu::TestLog::EndMessage;
			error = true;
		}

		if (error)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid precision/range");
	}